

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

string * duckdb::StrTimeFormat::ParseFormatSpecifier
                   (string *__return_storage_ptr__,string *format_string,StrTimeFormat *format)

{
  byte bVar1;
  pointer pSVar2;
  pointer piVar3;
  pointer pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  long lVar8;
  string *psVar9;
  byte bVar10;
  ulong uVar11;
  reference pvVar12;
  reference pvVar13;
  long *plVar14;
  InternalException *this;
  char *pcVar15;
  size_type *psVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  size_type __n;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  string current_literal;
  string subformat;
  StrfTimeFormat locale_format;
  string error;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  char *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  string *local_218;
  string local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  _func_int **local_1e8;
  string *local_1e0;
  string local_1d8;
  undefined1 local_1b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  vector<duckdb::StrTimeSpecifier,_true> local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_178;
  idx_t local_160;
  pointer piStack_158;
  pointer local_150;
  pointer piStack_148;
  void *local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  void *pvStack_128;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_108;
  undefined **local_100;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  char *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (format_string->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Empty format string","");
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&format->format_specifier);
    pSVar2 = (format->specifiers).
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((format->specifiers).
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
      (format->specifiers).
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar2;
    }
    local_f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &format->literals;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
    piVar3 = (format->numeric_width).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((format->numeric_width).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar3) {
      (format->numeric_width).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar3;
    }
    format->constant_size = 0;
    local_238 = &local_228;
    local_230 = (char *)0x0;
    local_228._M_allocated_capacity._0_4_ = local_228._M_allocated_capacity._0_4_ & 0xffffff00;
    uVar11 = format_string->_M_string_length;
    bVar21 = uVar11 != 0;
    local_218 = __return_storage_ptr__;
    if (uVar11 == 0) {
      uVar18 = 0;
    }
    else {
      local_1f0 = &__return_storage_ptr__->field_2;
      local_100 = &PTR__StrTimeFormat_0247ffd0;
      local_1e8 = (_func_int **)&PTR__StrfTimeFormat_02480008;
      uVar19 = 0;
      uVar18 = 0;
      local_1e0 = format_string;
      do {
        if ((format_string->_M_dataplus)._M_p[uVar19] != '%') goto LAB_01146b82;
        uVar20 = uVar19 + 1;
        if (uVar20 == uVar11) {
          (local_218->_M_dataplus)._M_p = (pointer)local_1f0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,"Trailing format character %","");
          break;
        }
        if (uVar18 < uVar19) {
          ::std::__cxx11::string::substr((ulong)local_1b8,(ulong)format_string);
          ::std::__cxx11::string::_M_append((char *)&local_238,local_1b8._0_8_);
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_);
          }
        }
        pcVar4 = (format_string->_M_dataplus)._M_p;
        bVar1 = pcVar4[uVar20];
        bVar7 = false;
        switch(bVar1 - 0x41) {
        case 0:
switchD_01146618_caseD_0:
          bVar10 = 1;
          break;
        case 1:
switchD_01146618_caseD_1:
          bVar10 = 6;
          break;
        case 2:
        case 3:
        case 4:
        case 5:
        case 9:
        case 10:
        case 0xb:
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x11:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
        case 0x1e:
        case 0x1f:
        case 0x24:
        case 0x28:
        case 0x2a:
        case 0x2b:
        case 0x2e:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x35:
switchD_01146618_caseD_2:
          local_1b8._0_8_ = local_1b8 + 0x10;
          ::std::__cxx11::string::_M_construct((ulong)local_1b8,'\x01');
          plVar14 = (long *)::std::__cxx11::string::replace
                                      ((ulong)local_1b8,0,(char *)0x0,0x1ddd032);
          (local_218->_M_dataplus)._M_p = (pointer)local_1f0;
          psVar16 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar16) {
            uVar5 = *(undefined4 *)((long)plVar14 + 0x14);
            lVar8 = plVar14[3];
            uVar6 = *(undefined4 *)((long)plVar14 + 0x1c);
            *(int *)local_1f0 = (int)*psVar16;
            *(undefined4 *)((long)local_1f0 + 4) = uVar5;
            *(int *)((long)local_1f0 + 8) = (int)lVar8;
            *(undefined4 *)((long)local_1f0 + 0xc) = uVar6;
          }
          else {
            (local_218->_M_dataplus)._M_p = (pointer)*plVar14;
            (local_218->field_2)._M_allocated_capacity = *psVar16;
          }
          local_218->_M_string_length = plVar14[1];
          *plVar14 = (long)psVar16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_);
          }
          bVar7 = true;
          uVar11 = uVar18;
          goto LAB_01146b6b;
        case 6:
switchD_01146618_caseD_6:
          bVar10 = 0x21;
          break;
        case 7:
switchD_01146618_caseD_7:
          bVar10 = 0xc;
          break;
        case 8:
switchD_01146618_caseD_8:
          bVar10 = 0xe;
          break;
        case 0xc:
switchD_01146618_caseD_c:
          bVar10 = 0x11;
          break;
        case 0x12:
switchD_01146618_caseD_12:
          bVar10 = 0x13;
          break;
        case 0x13:
        case 0x17:
        case 0x22:
        case 0x37:
switchD_01146618_caseD_13:
          paVar17 = &local_210.field_2;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          local_1d8._M_string_length = 0;
          local_1d8.field_2._M_local_buf[0] = '\0';
          if (bVar1 < 99) {
            if ((bVar1 == 0x54) || (bVar1 == 0x58)) {
              pcVar15 = "%H:%M:%S";
              goto LAB_011466e8;
            }
          }
          else {
            pcVar15 = "%Y-%m-%d";
            if (bVar1 != 0x78) {
              if (bVar1 != 99) goto LAB_011466f6;
              pcVar15 = "%Y-%m-%d %H:%M:%S";
            }
LAB_011466e8:
            ::std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,(ulong)pcVar15);
          }
LAB_011466f6:
          local_1b8._8_8_ = &local_1a0;
          local_1b8._16_8_ = 0;
          local_1a0._M_local_buf[0] = '\0';
          local_150 = (pointer)0x0;
          piStack_148 = (pointer)0x0;
          local_160 = 0;
          piStack_158 = (pointer)0x0;
          vStack_178.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_178.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_190.
          super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
          super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_178.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_190.
          super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
          super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_190.
          super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
          super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1b8._0_8_ = local_1e8;
          local_118 = 0;
          local_110 = 0;
          local_108 = 0;
          local_120 = 0;
          local_130 = 0;
          pvStack_128 = (void *)0x0;
          local_140 = (void *)0x0;
          uStack_138 = 0;
          ParseFormatSpecifier(&local_b0,&local_1d8,(StrTimeFormat *)local_1b8);
          if (local_b0._M_string_length != 0) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_210._M_dataplus._M_p = (pointer)paVar17;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_210,"Failed to bind sub-format specifier \"%s\": %s","");
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,local_1d8._M_dataplus._M_p,
                       local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_b0._M_dataplus._M_p,
                       local_b0._M_dataplus._M_p + local_b0._M_string_length);
            InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                      (this,&local_210,&local_50,&local_70);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&vStack_178,0);
          plVar14 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_238,(ulong)(pvVar12->_M_dataplus)._M_p);
          psVar16 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_210.field_2._M_allocated_capacity = *psVar16;
            local_210.field_2._8_8_ = plVar14[3];
            local_210._M_dataplus._M_p = (pointer)paVar17;
          }
          else {
            local_210.field_2._M_allocated_capacity = *psVar16;
            local_210._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_210._M_string_length = plVar14[1];
          *plVar14 = (long)psVar16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&vStack_178,0);
          ::std::__cxx11::string::operator=((string *)pvVar12,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar17) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          ::std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1f09e61);
          if (local_190.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
              super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_190.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
              super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __n = 0;
            do {
              pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[](&vStack_178,__n);
              local_d0 = (size_type *)(pvVar12->_M_dataplus)._M_p;
              paVar17 = &pvVar12->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0 == paVar17) {
                local_c0 = paVar17->_M_allocated_capacity;
                uStack_b8 = *(undefined8 *)((long)&pvVar12->field_2 + 8);
                local_d0 = &local_c0;
              }
              else {
                local_c0 = paVar17->_M_allocated_capacity;
              }
              local_c8 = pvVar12->_M_string_length;
              (pvVar12->_M_dataplus)._M_p = (pointer)paVar17;
              pvVar12->_M_string_length = 0;
              (pvVar12->field_2)._M_local_buf[0] = '\0';
              pvVar13 = vector<duckdb::StrTimeSpecifier,_true>::operator[](&local_190,__n);
              (*format->_vptr_StrTimeFormat[2])(format,&local_d0,(ulong)*pvVar13);
              if (local_d0 != &local_c0) {
                operator_delete(local_d0);
              }
              __n = __n + 1;
            } while (__n < (ulong)((long)local_190.
                                         super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                         .
                                         super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_190.
                                        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                        .
                                        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          local_1b8._0_8_ = local_1e8;
          if (pvStack_128 != (void *)0x0) {
            operator_delete(pvStack_128);
            pvStack_128 = (void *)0x0;
            local_120 = 0;
            local_118 = 0;
            local_110 = 0;
            local_108 = 0;
          }
          if (local_140 != (void *)0x0) {
            operator_delete(local_140);
          }
          ~StrTimeFormat((StrTimeFormat *)local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p);
          }
          uVar11 = uVar19 + 2;
          goto LAB_01146b6b;
        case 0x14:
switchD_01146618_caseD_14:
          bVar10 = 0x1b;
          break;
        case 0x15:
switchD_01146618_caseD_15:
          bVar10 = 0x23;
          break;
        case 0x16:
switchD_01146618_caseD_16:
          bVar10 = 0x1c;
          break;
        case 0x18:
switchD_01146618_caseD_18:
          bVar10 = 0xb;
          break;
        case 0x19:
switchD_01146618_caseD_19:
          bVar10 = 0x18;
          break;
        case 0x20:
switchD_01146618_caseD_20:
          bVar10 = 0;
          break;
        case 0x21:
        case 0x27:
switchD_01146618_caseD_21:
          bVar10 = 5;
          break;
        case 0x23:
switchD_01146618_caseD_23:
          bVar10 = 3;
          break;
        case 0x25:
switchD_01146618_caseD_25:
          bVar10 = 0x15;
          break;
        case 0x26:
switchD_01146618_caseD_26:
          bVar10 = 0x16;
          break;
        case 0x29:
switchD_01146618_caseD_29:
          bVar10 = 0x19;
          break;
        case 0x2c:
switchD_01146618_caseD_2c:
          bVar10 = 7;
          break;
        case 0x2d:
switchD_01146618_caseD_2d:
          bVar10 = 0x20;
          break;
        case 0x2f:
switchD_01146618_caseD_2f:
          bVar10 = 0x10;
          break;
        case 0x34:
switchD_01146618_caseD_34:
          bVar10 = 0x22;
          break;
        case 0x36:
switchD_01146618_caseD_36:
          bVar10 = 2;
          break;
        case 0x38:
switchD_01146618_caseD_38:
          bVar10 = 9;
          break;
        case 0x39:
switchD_01146618_caseD_39:
          bVar10 = 0x17;
          break;
        default:
          uVar11 = uVar20;
          if (bVar1 != 0x25) {
            if (bVar1 == 0x2d) {
              uVar11 = uVar19 + 2;
              if (uVar11 < local_1e0->_M_string_length) {
                bVar1 = pcVar4[uVar11];
                uVar20 = uVar11;
                if (bVar1 < 100) {
                  if (bVar1 < 0x4d) {
                    if (bVar1 == 0x48) {
                      bVar10 = 0xd;
                    }
                    else {
                      if (bVar1 != 0x49) {
LAB_01146c30:
                        local_1b8._0_8_ = local_1b8 + 0x10;
                        ::std::__cxx11::string::_M_construct((ulong)local_1b8,'\x01');
                        ::std::operator+(local_218,"Unrecognized format for strftime/strptime: %-",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1b8);
                        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                          operator_delete((void *)local_1b8._0_8_);
                        }
                        bVar7 = true;
                        uVar11 = uVar18;
                        goto LAB_01146b6b;
                      }
                      bVar10 = 0xf;
                    }
                  }
                  else if (bVar1 == 0x4d) {
                    bVar10 = 0x12;
                  }
                  else {
                    if (bVar1 != 0x53) goto LAB_01146c30;
                    bVar10 = 0x14;
                  }
                }
                else if (bVar1 < 0x6d) {
                  bVar10 = 4;
                  if (bVar1 != 100) {
                    if (bVar1 != 0x6a) goto LAB_01146c30;
                    bVar10 = 0x1a;
                  }
                }
                else if (bVar1 == 0x79) {
                  bVar10 = 10;
                }
                else {
                  if (bVar1 != 0x6d) goto LAB_01146c30;
                  bVar10 = 8;
                }
                break;
              }
              switch(bVar1 - 0x41) {
              case 0:
                goto switchD_01146618_caseD_0;
              case 1:
                goto switchD_01146618_caseD_1;
              case 6:
                goto switchD_01146618_caseD_6;
              case 7:
                goto switchD_01146618_caseD_7;
              case 8:
                goto switchD_01146618_caseD_8;
              case 0xc:
                goto switchD_01146618_caseD_c;
              case 0x12:
                goto switchD_01146618_caseD_12;
              case 0x13:
              case 0x17:
              case 0x22:
              case 0x37:
                goto switchD_01146618_caseD_13;
              case 0x14:
                goto switchD_01146618_caseD_14;
              case 0x15:
                goto switchD_01146618_caseD_15;
              case 0x16:
                goto switchD_01146618_caseD_16;
              case 0x18:
                goto switchD_01146618_caseD_18;
              case 0x19:
                goto switchD_01146618_caseD_19;
              case 0x20:
                goto switchD_01146618_caseD_20;
              case 0x21:
              case 0x27:
                goto switchD_01146618_caseD_21;
              case 0x23:
                goto switchD_01146618_caseD_23;
              case 0x25:
                goto switchD_01146618_caseD_25;
              case 0x26:
                goto switchD_01146618_caseD_26;
              case 0x29:
                goto switchD_01146618_caseD_29;
              case 0x2c:
                goto switchD_01146618_caseD_2c;
              case 0x2d:
                goto switchD_01146618_caseD_2d;
              case 0x2f:
                goto switchD_01146618_caseD_2f;
              case 0x34:
                goto switchD_01146618_caseD_34;
              case 0x36:
                goto switchD_01146618_caseD_36;
              case 0x38:
                goto switchD_01146618_caseD_38;
              case 0x39:
                goto switchD_01146618_caseD_39;
              }
            }
            goto switchD_01146618_caseD_2;
          }
          goto LAB_01146b6b;
        }
        if (local_238 == &local_228) {
          local_e0._8_4_ = local_228._8_4_;
          local_e0._12_4_ = local_228._12_4_;
          local_f0 = &local_e0;
        }
        else {
          local_f0 = local_238;
        }
        local_e0._M_allocated_capacity._4_4_ = local_228._M_allocated_capacity._4_4_;
        local_e0._M_allocated_capacity._0_4_ = local_228._M_allocated_capacity._0_4_;
        local_e8 = local_230;
        local_230 = (char *)0x0;
        local_228._M_allocated_capacity._0_4_ = local_228._M_allocated_capacity._0_4_ & 0xffffff00;
        local_238 = &local_228;
        (*format->_vptr_StrTimeFormat[2])(format,&local_f0,(ulong)bVar10);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        ::std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1f09e61);
        bVar7 = false;
        uVar11 = uVar20 + 1;
LAB_01146b6b:
        uVar19 = uVar20;
        uVar18 = uVar11;
        format_string = local_1e0;
        if (bVar7) break;
LAB_01146b82:
        uVar19 = uVar19 + 1;
        uVar11 = format_string->_M_string_length;
        bVar21 = uVar19 < uVar11;
      } while (bVar21);
    }
    if (!bVar21) {
      if (uVar18 < format_string->_M_string_length) {
        ::std::__cxx11::string::substr((ulong)local_1b8,(ulong)format_string);
        ::std::__cxx11::string::_M_append((char *)&local_238,local_1b8._0_8_);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_);
        }
      }
      psVar9 = local_218;
      pcVar15 = local_230;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      if (local_238 != &local_228) {
        local_90._M_dataplus._M_p = (pointer)local_238;
      }
      local_90.field_2._M_allocated_capacity._4_4_ = local_228._M_allocated_capacity._4_4_;
      local_90.field_2._M_allocated_capacity._0_4_ = local_228._M_allocated_capacity._0_4_;
      local_90._M_string_length = (size_type)local_230;
      local_230 = (char *)0x0;
      local_228._M_allocated_capacity._0_4_ = local_228._M_allocated_capacity._0_4_ & 0xffffff00;
      format->constant_size = (idx_t)(pcVar15 + format->constant_size);
      local_238 = &local_228;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_f8,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
      psVar9->_M_string_length = 0;
      (psVar9->field_2)._M_local_buf[0] = '\0';
    }
    __return_storage_ptr__ = local_218;
    if (local_238 != &local_228) {
      operator_delete(local_238);
      __return_storage_ptr__ = local_218;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string StrTimeFormat::ParseFormatSpecifier(const string &format_string, StrTimeFormat &format) {
	if (format_string.empty()) {
		return "Empty format string";
	}
	format.format_specifier = format_string;
	format.specifiers.clear();
	format.literals.clear();
	format.numeric_width.clear();
	format.constant_size = 0;
	idx_t pos = 0;
	string current_literal;
	for (idx_t i = 0; i < format_string.size(); i++) {
		if (format_string[i] == '%') {
			if (i + 1 == format_string.size()) {
				return "Trailing format character %";
			}
			if (i > pos) {
				// push the previous string to the current literal
				current_literal += format_string.substr(pos, i - pos);
			}
			char format_char = format_string[++i];
			if (format_char == '%') {
				// special case: %%
				// set the pos for the next literal and continue
				pos = i;
				continue;
			}
			StrTimeSpecifier specifier;
			if (format_char == '-' && i + 1 < format_string.size()) {
				format_char = format_string[++i];
				switch (format_char) {
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_DECIMAL;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_DECIMAL;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_DECIMAL;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_DECIMAL;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_DECIMAL;
					break;
				default:
					return "Unrecognized format for strftime/strptime: %-" + string(1, format_char);
				}
			} else {
				switch (format_char) {
				case 'a':
					specifier = StrTimeSpecifier::ABBREVIATED_WEEKDAY_NAME;
					break;
				case 'A':
					specifier = StrTimeSpecifier::FULL_WEEKDAY_NAME;
					break;
				case 'w':
					specifier = StrTimeSpecifier::WEEKDAY_DECIMAL;
					break;
				case 'u':
					specifier = StrTimeSpecifier::WEEKDAY_ISO;
					break;
				case 'd':
					specifier = StrTimeSpecifier::DAY_OF_MONTH_PADDED;
					break;
				case 'h':
				case 'b':
					specifier = StrTimeSpecifier::ABBREVIATED_MONTH_NAME;
					break;
				case 'B':
					specifier = StrTimeSpecifier::FULL_MONTH_NAME;
					break;
				case 'm':
					specifier = StrTimeSpecifier::MONTH_DECIMAL_PADDED;
					break;
				case 'y':
					specifier = StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED;
					break;
				case 'Y':
					specifier = StrTimeSpecifier::YEAR_DECIMAL;
					break;
				case 'G':
					specifier = StrTimeSpecifier::YEAR_ISO;
					break;
				case 'H':
					specifier = StrTimeSpecifier::HOUR_24_PADDED;
					break;
				case 'I':
					specifier = StrTimeSpecifier::HOUR_12_PADDED;
					break;
				case 'p':
					specifier = StrTimeSpecifier::AM_PM;
					break;
				case 'M':
					specifier = StrTimeSpecifier::MINUTE_PADDED;
					break;
				case 'S':
					specifier = StrTimeSpecifier::SECOND_PADDED;
					break;
				case 'n':
					specifier = StrTimeSpecifier::NANOSECOND_PADDED;
					break;
				case 'f':
					specifier = StrTimeSpecifier::MICROSECOND_PADDED;
					break;
				case 'g':
					specifier = StrTimeSpecifier::MILLISECOND_PADDED;
					break;
				case 'z':
					specifier = StrTimeSpecifier::UTC_OFFSET;
					break;
				case 'Z':
					specifier = StrTimeSpecifier::TZ_NAME;
					break;
				case 'j':
					specifier = StrTimeSpecifier::DAY_OF_YEAR_PADDED;
					break;
				case 'U':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_SUN_FIRST;
					break;
				case 'W':
					specifier = StrTimeSpecifier::WEEK_NUMBER_PADDED_MON_FIRST;
					break;
				case 'V':
					specifier = StrTimeSpecifier::WEEK_NUMBER_ISO;
					break;
				case 'c':
				case 'x':
				case 'X':
				case 'T': {
					string subformat;
					if (format_char == 'c') {
						// %c: Locale’s appropriate date and time representation.
						// we push the ISO timestamp representation here
						subformat = "%Y-%m-%d %H:%M:%S";
					} else if (format_char == 'x') {
						// %x - Locale’s appropriate date representation.
						// we push the ISO date format here
						subformat = "%Y-%m-%d";
					} else if (format_char == 'X' || format_char == 'T') {
						// %X - Locale’s appropriate time representation.
						// we push the ISO time format here
						subformat = "%H:%M:%S";
					}
					// parse the subformat in a separate format specifier
					StrfTimeFormat locale_format;
					string error = StrTimeFormat::ParseFormatSpecifier(subformat, locale_format);
					if (!error.empty()) {
						throw InternalException("Failed to bind sub-format specifier \"%s\": %s", subformat, error);
					}
					// add the previous literal to the first literal of the subformat
					locale_format.literals[0] = std::move(current_literal) + locale_format.literals[0];
					current_literal = "";
					// now push the subformat into the current format specifier
					for (idx_t i = 0; i < locale_format.specifiers.size(); i++) {
						format.AddFormatSpecifier(std::move(locale_format.literals[i]), locale_format.specifiers[i]);
					}
					pos = i + 1;
					continue;
				}
				default:
					return "Unrecognized format for strftime/strptime: %" + string(1, format_char);
				}
			}
			format.AddFormatSpecifier(std::move(current_literal), specifier);
			current_literal = "";
			pos = i + 1;
		}
	}
	// add the final literal
	if (pos < format_string.size()) {
		current_literal += format_string.substr(pos, format_string.size() - pos);
	}
	format.AddLiteral(std::move(current_literal));
	return string();
}